

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testmult.cc
# Opt level: O0

void do_work(void)

{
  int iVar1;
  int me;
  int i;
  int in_stack_00000220;
  int in_stack_00000224;
  int local_4;
  
  iVar1 = GA_Nodeid();
  for (local_4 = 2; local_4 < 8; local_4 = local_4 + 1) {
    test(in_stack_00000224,in_stack_00000220);
    test(in_stack_00000224,in_stack_00000220);
    test(in_stack_00000224,in_stack_00000220);
    if (iVar1 == 0) {
      printf("\n\n");
    }
    GA::GAServices::sync((GAServices *)&GA::SERVICES);
  }
  return;
}

Assistant:

void
do_work() {
  int i;
  int me = GA_Nodeid();
 
  for(i=2; i<=GA_MAX_DIM; i++) {
     test(C_FLOAT, i);
     test(C_DBL,   i);
     test(C_DCPL,  i);
     if(me == 0) printf("\n\n");
    GA::SERVICES.sync();
  }
}